

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

time_t ns_mgr_poll(ns_mgr *mgr,int milli)

{
  ns_connection *pnVar1;
  uint __i_1;
  uint uVar2;
  int iVar3;
  ssize_t sVar4;
  ns_connection *nc;
  ctl_msg *p;
  uint __i;
  long lVar5;
  ulong n_00;
  ns_connection *pnVar6;
  time_t current_time;
  sock_t max_fd;
  int local_21fc;
  socklen_t local_21f8;
  int n;
  ns_connection *local_21f0;
  ns_connection local_21e8;
  timeval tv;
  fd_set read_set;
  fd_set write_set;
  ctl_msg ctl_msg;
  
  max_fd = -1;
  local_21fc = milli;
  current_time = time((time_t *)0x0);
  for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
    read_set.fds_bits[lVar5] = 0;
  }
  for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
    write_set.fds_bits[lVar5] = 0;
  }
  ns_add_to_set(mgr->ctl[1],&read_set,&max_fd);
  pnVar1 = mgr->active_connections;
  local_21f0 = (ns_connection *)mgr;
  while (pnVar6 = pnVar1, pnVar6 != (ns_connection *)0x0) {
    pnVar1 = pnVar6->next;
    uVar2 = pnVar6->flags;
    if ((uVar2 & 0x88) == 0) {
      ns_call(pnVar6,0,&current_time);
      uVar2 = pnVar6->flags;
    }
    if ((uVar2 & 0x40) == 0) {
      ns_add_to_set(pnVar6->sock,&read_set,&max_fd);
      uVar2 = pnVar6->flags;
    }
    if (((uVar2 & 0x28) == 8) || (((uVar2 & 10) == 0 && ((pnVar6->send_iobuf).len != 0)))) {
      ns_add_to_set(pnVar6->sock,&write_set,&max_fd);
      uVar2 = pnVar6->flags;
    }
    if ((uVar2 & 0x10) != 0) {
      ns_close_conn(pnVar6);
    }
  }
  tv.tv_sec = (__time_t)(local_21fc / 1000);
  tv.tv_usec = (__suseconds_t)((local_21fc % 1000) * 1000);
  iVar3 = select(max_fd + 1,(fd_set *)&read_set,(fd_set *)&write_set,(fd_set *)0x0,(timeval *)&tv);
  if (0 < iVar3) {
    current_time = time((time_t *)0x0);
    pnVar1 = local_21f0;
    iVar3 = *(int *)((long)&local_21f0->listener + 4);
    if ((iVar3 != -1) &&
       (((ulong)read_set.fds_bits[iVar3 / 0x40] >> ((long)iVar3 % 0x40 & 0x3fU) & 1) != 0)) {
      sVar4 = recv(iVar3,&ctl_msg,0x2008,0);
      send(*(int *)((long)&pnVar1->listener + 4),ctl_msg.message,1,0);
      if ((7 < (int)sVar4) &&
         (pnVar6 = pnVar1, CONCAT44(ctl_msg.callback._4_4_,(uint)ctl_msg.callback) != 0)) {
        while (pnVar6 = pnVar6->next, pnVar6 != (ns_connection *)0x0) {
          (*(code *)CONCAT44(ctl_msg.callback._4_4_,(uint)ctl_msg.callback))
                    (pnVar6,0,ctl_msg.message);
        }
      }
    }
    pnVar1 = pnVar1->next;
    while (pnVar6 = pnVar1, pnVar6 != (ns_connection *)0x0) {
      pnVar1 = pnVar6->next;
      iVar3 = pnVar6->sock;
      if (((ulong)read_set.fds_bits[iVar3 / 0x40] >> ((long)iVar3 % 0x40 & 0x3fU) & 1) != 0) {
        if ((char)pnVar6->flags < '\0') {
          if ((pnVar6->flags >> 8 & 1) == 0) {
            local_21e8.next._0_1_ = '\x10';
            local_21e8.next._1_1_ = '\0';
            local_21e8.next._2_1_ = '\0';
            local_21e8.next._3_1_ = '\0';
            iVar3 = accept(iVar3,(sockaddr *)&ctl_msg,(socklen_t *)&local_21e8);
            if (iVar3 != -1) {
              nc = ns_add_sock(pnVar6->mgr,iVar3,pnVar6->callback,pnVar6->user_data);
              if (nc != (ns_connection *)0x0) {
                nc->listener = pnVar6;
                nc->proto_data = pnVar6->proto_data;
                iVar3 = 1;
                p = &ctl_msg;
                goto LAB_001056b9;
              }
              close(iVar3);
            }
          }
          else {
            local_21f8 = 0x10;
            memset(&local_21e8,0,0xa0);
            sVar4 = recvfrom(pnVar6->sock,&ctl_msg,2000,0,(sockaddr *)&local_21e8.sa.sa,&local_21f8)
            ;
            n = (int)sVar4;
            if (0 < n) {
              local_21e8.mgr = pnVar6->mgr;
              local_21e8.recv_iobuf.len = (size_t)(n & 0x7fffffff);
              local_21e8.sock = pnVar6->sock;
              local_21e8.callback = pnVar6->callback;
              local_21e8.user_data = pnVar6->user_data;
              local_21e8.proto_data = pnVar6->proto_data;
              local_21e8.flags = 0x100;
              iVar3 = 3;
              p = (ctl_msg *)&n;
              nc = &local_21e8;
              local_21e8.listener = pnVar6;
              local_21e8.recv_iobuf.buf = (char *)&ctl_msg;
              local_21e8.recv_iobuf.size = local_21e8.recv_iobuf.len;
LAB_001056b9:
              ns_call(nc,iVar3,p);
            }
          }
        }
        else {
          pnVar6->last_io_time = current_time;
          ns_read_from_socket(pnVar6);
        }
      }
      iVar3 = pnVar6->sock;
      if (((ulong)write_set.fds_bits[iVar3 / 0x40] >> ((long)iVar3 % 0x40 & 0x3fU) & 1) != 0) {
        if ((pnVar6->flags & 8) == 0) {
          if ((pnVar6->flags & 2) == 0) {
            pnVar6->last_io_time = current_time;
            sVar4 = send(iVar3,(pnVar6->send_iobuf).buf,(pnVar6->send_iobuf).len,0);
            ctl_msg.callback._0_4_ = (uint)sVar4;
            ns_call(pnVar6,4,&ctl_msg);
            uVar2 = (uint)ctl_msg.callback;
            n_00 = (ulong)(uint)ctl_msg.callback;
            iVar3 = ns_is_error((uint)ctl_msg.callback);
            if (iVar3 == 0) {
              if (0 < (int)uVar2) {
                iobuf_remove(&pnVar6->send_iobuf,n_00);
              }
            }
            else {
              *(byte *)&pnVar6->flags = (byte)pnVar6->flags | 0x10;
            }
          }
        }
        else {
          ns_read_from_socket(pnVar6);
        }
      }
    }
  }
  pnVar1 = local_21f0->next;
  while (pnVar6 = pnVar1, pnVar6 != (ns_connection *)0x0) {
    pnVar1 = pnVar6->next;
    if (((pnVar6->flags & 0x10) != 0) ||
       (((pnVar6->flags & 1) != 0 && ((pnVar6->send_iobuf).len == 0)))) {
      ns_close_conn(pnVar6);
    }
  }
  return current_time;
}

Assistant:

time_t ns_mgr_poll(struct ns_mgr *mgr, int milli) {
  struct ns_connection *conn, *tmp_conn;
  struct timeval tv;
  fd_set read_set, write_set;
  sock_t max_fd = INVALID_SOCKET;
  time_t current_time = time(NULL);

  FD_ZERO(&read_set);
  FD_ZERO(&write_set);
  ns_add_to_set(mgr->ctl[1], &read_set, &max_fd);

  for (conn = mgr->active_connections; conn != NULL; conn = tmp_conn) {
    tmp_conn = conn->next;
    if (!(conn->flags & (NSF_LISTENING | NSF_CONNECTING))) {
      ns_call(conn, NS_POLL, &current_time);
    }
    if (!(conn->flags & NSF_WANT_WRITE)) {
      //DBG(("%p read_set", conn));
      ns_add_to_set(conn->sock, &read_set, &max_fd);
    }
    if (((conn->flags & NSF_CONNECTING) && !(conn->flags & NSF_WANT_READ)) ||
        (conn->send_iobuf.len > 0 && !(conn->flags & NSF_CONNECTING) &&
         !(conn->flags & NSF_BUFFER_BUT_DONT_SEND))) {
      //DBG(("%p write_set", conn));
      ns_add_to_set(conn->sock, &write_set, &max_fd);
    }
    if (conn->flags & NSF_CLOSE_IMMEDIATELY) {
      ns_close_conn(conn);
    }
  }

  tv.tv_sec = milli / 1000;
  tv.tv_usec = (milli % 1000) * 1000;

  if (select((int) max_fd + 1, &read_set, &write_set, NULL, &tv) > 0) {
    // select() might have been waiting for a long time, reset current_time
    // now to prevent last_io_time being set to the past.
    current_time = time(NULL);

    // Read wakeup messages
    if (mgr->ctl[1] != INVALID_SOCKET &&
        FD_ISSET(mgr->ctl[1], &read_set)) {
      struct ctl_msg ctl_msg;
      int len = (int) recv(mgr->ctl[1], (char *) &ctl_msg, sizeof(ctl_msg), 0);
      send(mgr->ctl[1], ctl_msg.message, 1, 0);
      if (len >= (int) sizeof(ctl_msg.callback) && ctl_msg.callback != NULL) {
        struct ns_connection *c;
        for (c = ns_next(mgr, NULL); c != NULL; c = ns_next(mgr, c)) {
          ctl_msg.callback(c, NS_POLL, ctl_msg.message);
        }
      }
    }

    for (conn = mgr->active_connections; conn != NULL; conn = tmp_conn) {
      tmp_conn = conn->next;
      if (FD_ISSET(conn->sock, &read_set)) {
        if (conn->flags & NSF_LISTENING) {
          if (conn->flags & NSF_UDP) {
            ns_handle_udp(conn);
          } else {
            // We're not looping here, and accepting just one connection at
            // a time. The reason is that eCos does not respect non-blocking
            // flag on a listening socket and hangs in a loop.
            accept_conn(conn);
          }
        } else {
          conn->last_io_time = current_time;
          ns_read_from_socket(conn);
        }
      }

      if (FD_ISSET(conn->sock, &write_set)) {
        if (conn->flags & NSF_CONNECTING) {
          ns_read_from_socket(conn);
        } else if (!(conn->flags & NSF_BUFFER_BUT_DONT_SEND)) {
          conn->last_io_time = current_time;
          ns_write_to_socket(conn);
        }
      }
    }
  }

  for (conn = mgr->active_connections; conn != NULL; conn = tmp_conn) {
    tmp_conn = conn->next;
    if ((conn->flags & NSF_CLOSE_IMMEDIATELY) ||
        (conn->send_iobuf.len == 0 &&
          (conn->flags & NSF_FINISHED_SENDING_DATA))) {
      ns_close_conn(conn);
    }
  }

  return current_time;
}